

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O2

void ncnn::im2col_sgemm_pack1to4_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int *piVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint _h;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  undefined1 *puVar18;
  undefined1 (*pauVar19) [16];
  size_t _elemsize;
  long lVar20;
  ulong uVar21;
  long lVar22;
  ulong *puVar23;
  long lVar24;
  undefined1 (*pauVar25) [16];
  int iVar26;
  undefined1 *puVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 local_98 [64];
  size_t local_58;
  ulong local_50;
  Mat *local_48;
  ulong local_40;
  ulong local_38;
  
  uVar2 = bottom_im2col->w;
  iVar26 = bottom_im2col->h;
  uVar11 = bottom_im2col->c;
  lVar14 = (long)(int)uVar11;
  local_50 = (ulong)(uint)top_blob->c;
  local_58 = 0;
  local_98._0_8_ = (void *)0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_98._16_8_ = 0;
  local_98._24_4_ = 0;
  local_98._32_8_ = (Allocator *)0x0;
  local_98._40_4_ = 0;
  local_98._44_4_ = 0;
  local_98._48_12_ = SUB1612((undefined1  [16])0x0,4);
  iVar9 = iVar26;
  uVar8 = uVar2;
  if (lVar14 < 4) {
    _elemsize = 1;
    iVar17 = 1;
    _h = uVar11;
    if (1 < (int)uVar2) {
      iVar9 = iVar26 * 2;
      uVar8 = (uVar2 & 1) + (uVar2 >> 1);
    }
  }
  else {
    _elemsize = 4;
    if ((int)uVar2 < 2) {
      _h = (uVar11 & 3) + (uVar11 >> 2);
    }
    else {
      _h = (uVar11 & 3) + (uVar11 >> 2);
      iVar9 = iVar26 * 2;
      uVar8 = (uVar2 & 1) + (uVar2 >> 1);
    }
    iVar17 = 4;
  }
  local_48 = top_blob;
  Mat::create((Mat *)local_98,iVar9,_h,uVar8,_elemsize,iVar17,opt->workspace_allocator);
  iVar9 = 0;
  if (0 < iVar26) {
    iVar9 = iVar26;
  }
  uVar16 = (ulong)(int)uVar2;
  local_40 = (ulong)(uint)((int)uVar2 >> 1);
  if ((int)uVar2 >> 1 < 1) {
    local_40 = 0;
  }
  lVar24 = 1;
  uVar28 = 0;
  while (uVar13 = uVar28, uVar13 != local_40) {
    puVar27 = (undefined1 *)(local_58 * uVar13 * local_98._16_8_ + local_98._0_8_);
    lVar12 = 1;
    lVar22 = 2;
    lVar20 = 3;
    for (uVar28 = 0; (long)(uVar28 | 3) < lVar14; uVar28 = uVar28 + 4) {
      lVar15 = bottom_im2col->elemsize * bottom_im2col->cstep;
      lVar10 = (long)bottom_im2col->data + lVar24;
      iVar17 = iVar9;
      while (bVar30 = iVar17 != 0, iVar17 = iVar17 + -1, bVar30) {
        *puVar27 = *(undefined1 *)(lVar10 + -1 + lVar15 * uVar28);
        puVar27[1] = *(undefined1 *)(lVar10 + -1 + lVar15 * lVar12);
        puVar27[2] = *(undefined1 *)(lVar10 + -1 + lVar15 * lVar22);
        puVar27[3] = *(undefined1 *)(lVar10 + -1 + lVar15 * lVar20);
        puVar27[4] = *(undefined1 *)(lVar10 + lVar15 * uVar28);
        puVar27[5] = *(undefined1 *)(lVar10 + lVar15 * lVar12);
        puVar27[6] = *(undefined1 *)(lVar10 + lVar15 * lVar22);
        puVar27[7] = *(undefined1 *)(lVar10 + lVar15 * lVar20);
        puVar27 = puVar27 + 8;
        lVar10 = lVar10 + uVar16;
      }
      lVar20 = lVar20 + 4;
      lVar22 = lVar22 + 4;
      lVar12 = lVar12 + 4;
    }
    for (; (long)uVar28 < lVar14; uVar28 = uVar28 + 1) {
      lVar12 = bottom_im2col->cstep * bottom_im2col->elemsize * uVar28;
      lVar22 = (long)bottom_im2col->data + lVar24;
      iVar17 = iVar9;
      while (bVar30 = iVar17 != 0, iVar17 = iVar17 + -1, bVar30) {
        *puVar27 = *(undefined1 *)(lVar22 + -1 + lVar12);
        puVar27[1] = *(undefined1 *)(lVar22 + lVar12);
        puVar27 = puVar27 + 2;
        lVar22 = lVar22 + uVar16;
      }
    }
    lVar24 = lVar24 + 2;
    local_38 = uVar13;
    uVar28 = uVar13 + 1;
  }
  for (uVar28 = uVar16 & 0xfffffffffffffffe; (long)uVar28 < (long)uVar16; uVar28 = uVar28 + 1) {
    uVar13 = (ulong)(uint)((int)uVar28 >> 0x1f) << 0x20 | uVar28 & 0xffffffff;
    puVar27 = (undefined1 *)
              ((long)((int)((long)uVar13 % 2) + (int)((long)uVar13 / 2)) * local_58 *
               local_98._16_8_ + local_98._0_8_);
    lVar24 = 1;
    lVar12 = 2;
    lVar22 = 3;
    for (uVar13 = 0; (long)(uVar13 | 3) < lVar14; uVar13 = uVar13 + 4) {
      lVar10 = bottom_im2col->elemsize * bottom_im2col->cstep;
      lVar20 = (long)bottom_im2col->data + uVar28;
      iVar17 = iVar9;
      while (bVar30 = iVar17 != 0, iVar17 = iVar17 + -1, bVar30) {
        *puVar27 = *(undefined1 *)(lVar20 + lVar10 * uVar13);
        puVar27[1] = *(undefined1 *)(lVar20 + lVar10 * lVar24);
        puVar27[2] = *(undefined1 *)(lVar20 + lVar10 * lVar12);
        puVar27[3] = *(undefined1 *)(lVar20 + lVar10 * lVar22);
        puVar27 = puVar27 + 4;
        lVar20 = lVar20 + uVar16;
      }
      lVar22 = lVar22 + 4;
      lVar12 = lVar12 + 4;
      lVar24 = lVar24 + 4;
    }
    for (; (long)uVar13 < lVar14; uVar13 = uVar13 + 1) {
      puVar18 = (undefined1 *)
                ((long)bottom_im2col->data +
                uVar28 + bottom_im2col->cstep * uVar13 * bottom_im2col->elemsize);
      iVar17 = iVar9;
      while (bVar30 = iVar17 != 0, iVar17 = iVar17 + -1, bVar30) {
        *puVar27 = *puVar18;
        puVar27 = puVar27 + 1;
        puVar18 = puVar18 + uVar16;
      }
    }
  }
  iVar9 = ((int)uVar11 / 4) * iVar26;
  uVar11 = ((int)uVar11 % 4) * iVar26;
  uVar13 = 0;
  uVar28 = (ulong)uVar11;
  if ((int)uVar11 < 1) {
    uVar28 = uVar13;
  }
  uVar29 = local_50 & 0xffffffff;
  if ((int)local_50 < 1) {
    uVar29 = uVar13;
  }
  do {
    if (uVar13 == uVar29) {
      piVar7 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
            free((void *)local_98._0_8_);
          }
          else {
            (*(*(_func_int ***)local_98._32_8_)[3])();
          }
        }
      }
      return;
    }
    pauVar19 = (undefined1 (*) [16])
               (local_48->cstep * uVar13 * local_48->elemsize + (long)local_48->data);
    for (uVar21 = 0; (long)(uVar21 | 1) < (long)uVar16; uVar21 = uVar21 + 2) {
      puVar23 = (ulong *)((uVar21 >> 1) * local_58 * local_98._16_8_ + local_98._0_8_);
      pauVar25 = (undefined1 (*) [16])
                 (kernel->cstep * uVar13 * kernel->elemsize + (long)kernel->data);
      auVar32 = ZEXT1664((undefined1  [16])0x0);
      if (iVar9 < 1) {
        auVar34 = ZEXT1664((undefined1  [16])0x0);
      }
      else {
        if (iVar9 != 0) {
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *puVar23;
          auVar35 = vpmovsxbw_avx(auVar31);
          auVar31 = *pauVar25;
          auVar33 = vpcmpgtb_avx((undefined1  [16])0x0,auVar31);
          vpunpcklbw_avx(auVar31,auVar33);
          vpunpckhbw_avx(auVar31,auVar33);
          vpshufd_avx(auVar35,0x44);
          halt_baddata();
        }
        auVar31 = vphaddd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
        auVar34 = ZEXT1664(auVar31);
        auVar31 = vphaddd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
        auVar32 = ZEXT1664(auVar31);
      }
      lVar14 = 0;
      while( true ) {
        if ((int)uVar28 == (int)lVar14) break;
        auVar31 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar23 + lVar14 * 2)));
        auVar31 = vpshuflw_avx(auVar31,0x50);
        auVar37 = vpshufd_avx(auVar31,0x50);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(*pauVar25 + lVar14 * 4);
        auVar31 = vpmovsxbw_avx(auVar33);
        auVar31 = vpshufd_avx(auVar31,0x44);
        auVar35 = vpmullw_avx(auVar37,auVar31);
        auVar33 = vpmulhw_avx(auVar37,auVar31);
        auVar31 = vpunpcklwd_avx(auVar35,auVar33);
        auVar31 = vpaddd_avx(auVar34._0_16_,auVar31);
        auVar34 = ZEXT1664(auVar31);
        auVar31 = vpunpckhwd_avx(auVar35,auVar33);
        auVar31 = vpaddd_avx(auVar32._0_16_,auVar31);
        auVar32 = ZEXT1664(auVar31);
        lVar14 = lVar14 + 1;
      }
      *pauVar19 = auVar34._0_16_;
      pauVar19[1] = auVar32._0_16_;
      pauVar19 = pauVar19 + 2;
    }
    while (uVar11 = (uint)uVar21, (int)uVar11 < (int)uVar2) {
      puVar23 = (ulong *)(((uVar11 & 1) + ((uint)(uVar21 >> 1) & 0x7fffffff)) * local_58 *
                          local_98._16_8_ + local_98._0_8_);
      pauVar25 = (undefined1 (*) [16])
                 (kernel->cstep * uVar13 * kernel->elemsize + (long)kernel->data);
      auVar32 = ZEXT1664((undefined1  [16])0x0);
      if (0 < iVar9) {
        auVar34 = ZEXT1664((undefined1  [16])0x0);
        auVar36 = ZEXT1664((undefined1  [16])0x0);
        auVar38 = ZEXT1664((undefined1  [16])0x0);
        iVar26 = iVar9;
        while( true ) {
          bVar30 = iVar26 == 0;
          iVar26 = iVar26 + -1;
          auVar31 = auVar32._0_16_;
          auVar33 = auVar34._0_16_;
          auVar35 = auVar36._0_16_;
          auVar37 = auVar38._0_16_;
          if (bVar30) break;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *puVar23;
          auVar4 = vpmovsxbw_avx(auVar1);
          auVar1 = *pauVar25;
          auVar3 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
          auVar6 = vpunpcklbw_avx(auVar1,auVar3);
          auVar5 = vpunpckhbw_avx(auVar1,auVar3);
          auVar3 = vpshufd_avx(auVar4,0x44);
          auVar4 = vpmullw_avx(auVar6,auVar3);
          auVar1 = vpmulhw_avx(auVar6,auVar3);
          auVar6 = vpmullw_avx(auVar3,auVar5);
          auVar3 = vpmulhw_avx(auVar3,auVar5);
          auVar5 = vpunpcklwd_avx(auVar4,auVar1);
          auVar31 = vpaddd_avx(auVar31,auVar5);
          auVar32 = ZEXT1664(auVar31);
          auVar31 = vpunpckhwd_avx(auVar4,auVar1);
          auVar31 = vpaddd_avx(auVar33,auVar31);
          auVar34 = ZEXT1664(auVar31);
          auVar31 = vpunpcklwd_avx(auVar6,auVar3);
          auVar31 = vpaddd_avx(auVar35,auVar31);
          auVar36 = ZEXT1664(auVar31);
          auVar31 = vpunpckhwd_avx(auVar6,auVar3);
          auVar31 = vpaddd_avx(auVar37,auVar31);
          auVar38 = ZEXT1664(auVar31);
          puVar23 = (ulong *)((long)puVar23 + 4);
          pauVar25 = pauVar25 + 1;
        }
        auVar1 = vpunpckldq_avx(auVar31,auVar33);
        auVar3 = vpunpckldq_avx(auVar35,auVar37);
        auVar33 = vpunpckhdq_avx(auVar31,auVar33);
        auVar35 = vpunpckhdq_avx(auVar35,auVar37);
        auVar37 = vpunpcklqdq_avx(auVar1,auVar3);
        auVar31 = vpunpckhqdq_avx(auVar1,auVar3);
        auVar31 = vpaddd_avx(auVar37,auVar31);
        auVar37 = vpunpcklqdq_avx(auVar33,auVar35);
        auVar33 = vpunpckhqdq_avx(auVar33,auVar35);
        auVar33 = vpaddd_avx(auVar33,auVar37);
        auVar31 = vpaddd_avx(auVar31,auVar33);
        auVar32 = ZEXT1664(auVar31);
      }
      for (lVar14 = 0; (int)uVar28 != (int)lVar14; lVar14 = lVar14 + 1) {
        auVar31 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar23 + lVar14)),0);
        auVar37 = vpshufd_avx(auVar31,0);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)(*pauVar25 + lVar14 * 4);
        auVar31 = vpmovsxbw_avx(auVar35);
        auVar33 = vpmullw_avx(auVar37,auVar31);
        auVar31 = vpmulhw_avx(auVar37,auVar31);
        auVar31 = vpunpcklwd_avx(auVar33,auVar31);
        auVar31 = vpaddd_avx(auVar32._0_16_,auVar31);
        auVar32 = ZEXT1664(auVar31);
      }
      *pauVar19 = auVar32._0_16_;
      pauVar19 = pauVar19 + 1;
      uVar21 = (ulong)(uVar11 + 1);
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void im2col_sgemm_pack1to4_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack1to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}